

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

void __thiscall HEkkDual::initialiseInstance(HEkkDual *this)

{
  _Base_ptr p_Var1;
  double *pdVar2;
  HEkkDualRow *in_RDI;
  HVectorBase<double> *unaff_retaddr;
  HEkkDualRow *pHVar3;
  HighsInt size_;
  
  *(HighsInt *)((long)&in_RDI->workMove + 4) = in_RDI->workNumTotPermutation[0x866];
  *(HighsInt *)&in_RDI->workMove = in_RDI->workNumTotPermutation[0x867];
  *(int *)&in_RDI->workDual = *(int *)((long)&in_RDI->workMove + 4) + *(int *)&in_RDI->workMove;
  in_RDI->workRange = (double *)(1.0 / (double)*(int *)&in_RDI->workMove);
  in_RDI->work_devex_index = in_RDI->workNumTotPermutation + 0x886;
  *(HighsInt **)&(in_RDI->freeList)._M_t._M_impl = in_RDI->workNumTotPermutation + 0xace;
  *(HighsInt **)&(in_RDI->freeList)._M_t._M_impl.super__Rb_tree_header._M_header =
       in_RDI->workNumTotPermutation + 6;
  pHVar3 = in_RDI;
  p_Var1 = (_Base_ptr)
           std::vector<signed_char,_std::allocator<signed_char>_>::data
                     ((vector<signed_char,_std::allocator<signed_char>_> *)0x7868d1);
  size_ = (HighsInt)((ulong)pHVar3 >> 0x20);
  (in_RDI->freeList)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var1;
  pdVar2 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x7868f1);
  (in_RDI->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)pdVar2;
  pdVar2 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x786914);
  (in_RDI->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)pdVar2;
  p_Var1 = (_Base_ptr)
           std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x786934);
  (in_RDI->freeList)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var1;
  p_Var1 = (_Base_ptr)
           std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x786957);
  (in_RDI->freeList)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Var1;
  pdVar2 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x78697a);
  (in_RDI->freeList)._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pdVar2;
  pdVar2 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x78699d);
  *(double **)&in_RDI->packCount = pdVar2;
  HVectorBase<double>::setup(unaff_retaddr,size_);
  HVectorBase<double>::setup(unaff_retaddr,size_);
  HVectorBase<double>::setup(unaff_retaddr,size_);
  HVectorBase<double>::setup(unaff_retaddr,size_);
  HVectorBase<double>::setup(unaff_retaddr,size_);
  HVectorBase<double>::setup(unaff_retaddr,size_);
  HVectorBase<double>::setup(unaff_retaddr,size_);
  HEkkDualRow::setup(in_RDI);
  HEkkDualRHS::setup((HEkkDualRHS *)in_RDI);
  return;
}

Assistant:

void HEkkDual::initialiseInstance() {
  // Called in constructor for HEkkDual class
  // Copy size, matrix and simplex NLA

  solver_num_col = ekk_instance_.lp_.num_col_;
  solver_num_row = ekk_instance_.lp_.num_row_;
  solver_num_tot = solver_num_col + solver_num_row;
  inv_solver_num_row = 1.0 / solver_num_row;

  a_matrix = &ekk_instance_.lp_.a_matrix_;
  simplex_nla = &ekk_instance_.simplex_nla_;
  analysis = &ekk_instance_.analysis_;

  // Copy pointers
  jMove = ekk_instance_.basis_.nonbasicMove_.data();
  workDual = ekk_instance_.info_.workDual_.data();
  workValue = ekk_instance_.info_.workValue_.data();
  workRange = ekk_instance_.info_.workRange_.data();
  baseLower = ekk_instance_.info_.baseLower_.data();
  baseUpper = ekk_instance_.info_.baseUpper_.data();
  baseValue = ekk_instance_.info_.baseValue_.data();

  // Setup local vectors
  col_DSE.setup(solver_num_row);
  col_BFRT.setup(solver_num_row);
  col_aq.setup(solver_num_row);
  row_ep.setup(solver_num_row);
  row_ap.setup(solver_num_col);

  dev_row_ep.setup(solver_num_row);
  dev_col_DSE.setup(solver_num_row);

  // Setup other buffers
  dualRow.setup();
  dualRHS.setup();
}